

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall Engine::printStats(Engine *this)

{
  long lVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  stringstream asStack_1f0 [16];
  ostream aoStack_1e0 [112];
  ios_base aiStack_170 [264];
  Engine *pEStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  uint *puStack_40;
  undefined8 uStack_38;
  
  puStack_40 = (uint *)0x1b87b3;
  uStack_38 = in_RAX;
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar1 = (lVar3 - (this->start_time).__d.__r) / 1000000;
  lVar3 = (this->init_time).__r;
  puStack_40 = (uint *)0x1b87f7;
  printf("%%%%%%mzn-stat: nodes=%lld\n",this->nodes);
  puStack_40 = (uint *)0x1b880c;
  printf("%%%%%%mzn-stat: failures=%lld\n",this->conflicts);
  puStack_40 = (uint *)0x1b8820;
  printf("%%%%%%mzn-stat: restarts=%d\n",(ulong)(uint)this->restart_count);
  puStack_40 = (uint *)0x1b883c;
  printf("%%%%%%mzn-stat: variables=%d\n",(ulong)(sat.assigns.sz + (this->vars).sz));
  puStack_40 = (uint *)0x1b884c;
  printf("%%%%%%mzn-stat: intVars=%d\n",(ulong)(this->vars).sz);
  puStack_40 = (uint *)0x1b8862;
  printf("%%%%%%mzn-stat: boolVariables=%d\n",(ulong)(sat.assigns.sz - 2));
  puStack_40 = (uint *)0x1b8873;
  printf("%%%%%%mzn-stat: propagators=%d\n",(ulong)(this->propagators).sz);
  puStack_40 = (uint *)0x1b8888;
  printf("%%%%%%mzn-stat: propagations=%lld\n",this->propagations);
  puStack_40 = (uint *)0x1b889c;
  printf("%%%%%%mzn-stat: peakDepth=%d\n",(ulong)(uint)this->peak_depth);
  puStack_40 = (uint *)0x1b88b1;
  printf("%%%%%%mzn-stat: nogoods=%lld\n",this->conflicts);
  puStack_40 = (uint *)0x1b88c7;
  printf("%%%%%%mzn-stat: backjumps=%lld\n",sat.back_jumps);
  puStack_40 = (uint *)0x1b88d8;
  printf("%%%%%%mzn-stat: peakMem=%.2f\n",0);
  puStack_40 = (uint *)0x1b88f6;
  printf("%%%%%%mzn-stat: time=%.3f\n",(double)lVar1 / 1000.0);
  puStack_40 = (uint *)0x1b8918;
  printf("%%%%%%mzn-stat: initTime=%.3f\n",(double)(this->init_time).__r / 1000.0);
  puStack_40 = (uint *)0x1b8936;
  printf("%%%%%%mzn-stat: solveTime=%.3f\n",(double)(lVar1 - lVar3) / 1000.0);
  if (this->opt_var != (IntVar *)0x0) {
    puStack_40 = (uint *)0x1b8951;
    printf("%%%%%%mzn-stat: objective=%d\n",(ulong)(uint)this->best_sol);
    puStack_40 = (uint *)0x1b8973;
    printf("%%%%%%mzn-stat: optTime=%.3f\n",(double)(this->opt_time).__r / 1000.0);
  }
  puStack_40 = (uint *)0x1b8989;
  printf("%%%%%%mzn-stat: baseMem=%.2f\n",this->base_memory);
  puStack_40 = (uint *)0x1b89b1;
  printf("%%%%%%mzn-stat: trailMem=%.2f\n",
         (double)((ulong)(this->trail).cap << 4) * 9.5367431640625e-07);
  plVar5 = (long *)(ulong)(uint)so.rnd_seed;
  uVar8 = 0;
  puStack_40 = (uint *)0x1b89cd;
  printf("%%%%%%mzn-stat: randomSeed=%d\n");
  uVar9 = uStack_38;
  if (1 < so.verbosity) {
    uVar10 = 0;
    uStack_38 = uStack_38 & 0xffffffff;
    uVar6 = 0;
    if ((this->vars).sz != 0) {
      uVar7 = 0;
      uVar6 = 0;
      uStack_38 = uVar9 & 0xffffffff;
      uVar10 = 0;
      uVar8 = 0;
      do {
        puStack_40 = (uint *)0x1b8a1a;
        iVar2 = (*((this->vars).data[uVar7]->super_Var).super_Branching._vptr_Branching[3])();
        switch(iVar2) {
        case 1:
          uVar6 = (ulong)((int)uVar6 + 1);
          break;
        case 2:
          uVar8 = (ulong)((int)uVar8 + 1);
          break;
        case 3:
          uVar10 = (ulong)((int)uVar10 + 1);
          break;
        case 4:
          uStack_38 = CONCAT44(uStack_38._4_4_ + 1,(undefined4)uStack_38);
          break;
        default:
          puStack_40 = (uint *)0x1b8b4b;
          printStats();
          puStack_40 = &switchD_001b8a2d::switchdataD_001dd088;
          pEStack_68 = this;
          uStack_60 = uVar6;
          uStack_58 = uVar7;
          uStack_50 = uVar8;
          uStack_48 = uVar10;
          std::__cxx11::stringstream::stringstream(asStack_1f0);
          if (plVar5[1] != *plVar5) {
            uVar4 = 1;
            uVar9 = 0;
            do {
              if (uVar4 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>(aoStack_1e0," ",1);
              }
              std::ostream::operator<<((ostream *)aoStack_1e0,*(int *)(*plVar5 + uVar9 * 4));
              uVar9 = (ulong)uVar4;
              uVar4 = uVar4 + 1;
            } while (uVar9 < (ulong)(plVar5[1] - *plVar5 >> 2));
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream(asStack_1f0);
          std::ios_base::~ios_base(aiStack_170);
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->vars).sz);
    }
    puStack_40 = (uint *)0x1b8a5d;
    printf("%%%%%%mzn-stat: noLitIntVars=%d\n",uVar6);
    puStack_40 = (uint *)0x1b8a6e;
    printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n",uVar8);
    puStack_40 = (uint *)0x1b8a7f;
    printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n",uVar10);
    puStack_40 = (uint *)0x1b8a91;
    printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n",uStack_38 >> 0x20);
    puStack_40 = (uint *)0x1b8aa6;
    printf("%%%%%%mzn-stat: solutions=%lld\n",this->solutions);
    if (so.ldsb != false) {
      puStack_40 = (uint *)0x1b8adc;
      printf("%%%%%%mzn-stat: ldsbTime=%.3f\n",(double)ldsb.ldsb_time.__r / 1000.0);
    }
    puStack_40 = (uint *)0x1b8ae8;
    SAT::printStats(&sat);
    if (so.mip == true) {
      puStack_40 = (uint *)0x1b8b01;
      (*(mip->super_Propagator)._vptr_Propagator[9])();
    }
    if (engine.propagators.sz != 0) {
      uVar9 = 0;
      do {
        puStack_40 = (uint *)0x1b8b1f;
        (*engine.propagators.data[uVar9]->_vptr_Propagator[9])();
        uVar9 = uVar9 + 1;
      } while (uVar9 < engine.propagators.sz);
    }
  }
  printf("%%%%%%mzn-stat-end\n");
  return;
}

Assistant:

void Engine::printStats() {
	auto total_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	const duration search_time = total_time - init_time;

	// MiniZinc standard statistics
	printf("%%%%%%mzn-stat: nodes=%lld\n", nodes);
	printf("%%%%%%mzn-stat: failures=%lld\n", conflicts);
	printf("%%%%%%mzn-stat: restarts=%d\n", restart_count);
	printf("%%%%%%mzn-stat: variables=%d\n", vars.size() + sat.nVars());
	printf("%%%%%%mzn-stat: intVars=%d\n", vars.size());
	printf("%%%%%%mzn-stat: boolVariables=%d\n", sat.nVars() - 2);  // Do not count constant
																																	// True/False
	//    printf("%%%%%%mzn-stat: floatVariables=%d\n", );
	//    printf("%%%%%%mzn-stat: setVariables=%d\n", );
	printf("%%%%%%mzn-stat: propagators=%d\n", propagators.size());
	printf("%%%%%%mzn-stat: propagations=%lld\n", propagations);
	printf("%%%%%%mzn-stat: peakDepth=%d\n", peak_depth);
	printf("%%%%%%mzn-stat: nogoods=%lld\n",
				 conflicts);  // TODO: Is this correct (e.g., sat.learnts.size())
	printf("%%%%%%mzn-stat: backjumps=%lld\n", sat.back_jumps);
	printf("%%%%%%mzn-stat: peakMem=%.2f\n", memUsed());
	printf("%%%%%%mzn-stat: time=%.3f\n", to_sec(total_time));
	printf("%%%%%%mzn-stat: initTime=%.3f\n", to_sec(init_time));
	printf("%%%%%%mzn-stat: solveTime=%.3f\n", to_sec(search_time));

	// Chuffed specific statistics
	if (opt_var != nullptr) {
		printf("%%%%%%mzn-stat: objective=%d\n", best_sol);
		printf("%%%%%%mzn-stat: optTime=%.3f\n", to_sec(opt_time));
	}
	printf("%%%%%%mzn-stat: baseMem=%.2f\n", base_memory);
	printf("%%%%%%mzn-stat: trailMem=%.2f\n", trail.capacity() * sizeof(TrailElem) / 1048576.0);
	printf("%%%%%%mzn-stat: randomSeed=%d\n", so.rnd_seed);

	if (so.verbosity >= 2) {
		int nl = 0;
		int el = 0;
		int ll = 0;
		int sl = 0;
		for (unsigned int i = 0; i < vars.size(); i++) {
			switch (vars[i]->getType()) {
				case INT_VAR:
					nl++;
					break;
				case INT_VAR_EL:
					el++;
					break;
				case INT_VAR_LL:
					ll++;
					break;
				case INT_VAR_SL:
					sl++;
					break;
				default:
					NEVER;
			}
		}
		printf("%%%%%%mzn-stat: noLitIntVars=%d\n", nl);
		printf("%%%%%%mzn-stat: eagerLitIntVars=%d\n", el);
		printf("%%%%%%mzn-stat: lazyLitIntVars=%d\n", ll);
		printf("%%%%%%mzn-stat: sparseLitIntVars=%d\n", sl);
		printf("%%%%%%mzn-stat: solutions=%lld\n", solutions);

		if (so.ldsb) {
			printf("%%%%%%mzn-stat: ldsbTime=%.3f\n", to_sec(ldsb.ldsb_time));
		}
		sat.printStats();
		/* sat.printLearntStats(); */
		if (so.mip) {
			mip->printStats();
		}
		for (unsigned int i = 0; i < engine.propagators.size(); i++) {
			engine.propagators[i]->printStats();
		}
	}
	printf("%%%%%%mzn-stat-end\n");
}